

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int incrVacuumStep(BtShared *pBt,Pgno nFin,Pgno iLastPg,int bCommit)

{
  Pgno PVar1;
  u32 iPtrPage_00;
  Pgno pgno;
  int in_ECX;
  Pgno in_EDX;
  Pgno in_ESI;
  BtShared *in_RDI;
  long in_FS_OFFSET;
  bool bVar2;
  BtShared *unaff_retaddr;
  Pgno dbSize;
  Pgno iNear;
  u8 eMode;
  int rc;
  Pgno nFreeList;
  MemPage *pFreePg_1;
  MemPage *pLastPg;
  Pgno iFreePg_1;
  MemPage *pFreePg;
  Pgno iFreePg;
  Pgno iPtrPage;
  u8 eType;
  bool local_6d;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa0;
  undefined4 uVar3;
  Pgno local_3c;
  u8 in_stack_ffffffffffffffeb;
  Pgno in_stack_ffffffffffffffec;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffff4;
  undefined4 uVar5;
  char cVar6;
  MemPage **ppPage;
  
  ppPage = *(MemPage ***)(in_FS_OFFSET + 0x28);
  uVar3 = 0xaaaaaaaa;
  PVar1 = ptrmapPageno(in_RDI,in_EDX);
  pgno = in_EDX;
  if ((PVar1 != in_EDX) && (in_EDX != (uint)sqlite3PendingByte / in_RDI->pageSize + 1)) {
    uVar5 = CONCAT13(0xaa,(int3)in_stack_fffffffffffffff4);
    uVar4 = 0xaaaaaaaa;
    iPtrPage_00 = sqlite3Get4byte(in_RDI->pPage1->aData + 0x24);
    if (iPtrPage_00 == 0) {
      local_3c = 0x65;
      goto LAB_0016c694;
    }
    local_3c = ptrmapGet(in_RDI,in_ESI,(u8 *)CONCAT44(in_ECX,iPtrPage_00),
                         (Pgno *)CONCAT44(uVar3,in_stack_ffffffffffffffa0));
    if (local_3c != 0) goto LAB_0016c694;
    cVar6 = (char)((uint)uVar5 >> 0x18);
    if (cVar6 == '\x01') {
      local_3c = sqlite3CorruptError(0);
      goto LAB_0016c694;
    }
    if (cVar6 == '\x02') {
      if (in_ECX == 0) {
        local_3c = allocateBtreePage(unaff_retaddr,ppPage,(Pgno *)CONCAT44(uVar5,uVar4),0xaaaaaaaa,
                                     in_stack_ffffffffffffffeb);
        if (local_3c != 0) goto LAB_0016c694;
        releasePage((MemPage *)0x16c4b4);
      }
    }
    else {
      in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 & 0xffffff;
      local_3c = btreeGetPage((BtShared *)CONCAT44(in_ECX,iPtrPage_00),0,
                              (MemPage **)(ulong)in_stack_ffffffffffffff98,in_EDX);
      if (local_3c != 0) goto LAB_0016c694;
      if (in_ECX == 0) {
        in_stack_ffffffffffffffa0 = CONCAT13(2,(int3)in_stack_ffffffffffffffa0);
      }
      do {
        PVar1 = btreePagecount(in_RDI);
        local_3c = allocateBtreePage(unaff_retaddr,ppPage,(Pgno *)CONCAT44(uVar5,uVar4),
                                     in_stack_ffffffffffffffec,in_stack_ffffffffffffffeb);
        if (local_3c != 0) {
          releasePage((MemPage *)0x16c570);
          goto LAB_0016c694;
        }
        releasePage((MemPage *)0x16c587);
        if (PVar1 < 0xaaaaaaaa) {
          releasePage((MemPage *)0x16c59b);
          local_3c = sqlite3CorruptError(0);
          goto LAB_0016c694;
        }
        local_6d = in_ECX != 0 && in_ESI < 0xaaaaaaaa;
      } while (local_6d);
      local_3c = relocatePage(in_RDI,(MemPage *)CONCAT44(in_ESI,pgno),(u8)((uint)in_ECX >> 0x18),
                              iPtrPage_00,local_3c,in_stack_ffffffffffffffa0);
      releasePage((MemPage *)0x16c60a);
      if (local_3c != 0) goto LAB_0016c694;
    }
  }
  if (in_ECX == 0) {
    do {
      pgno = pgno - 1;
      bVar2 = true;
      if (pgno != (uint)sqlite3PendingByte / in_RDI->pageSize + 1) {
        PVar1 = ptrmapPageno(in_RDI,pgno);
        bVar2 = PVar1 == pgno;
      }
    } while (bVar2);
    in_RDI->bDoTruncate = '\x01';
    in_RDI->nPage = pgno;
  }
  local_3c = 0;
LAB_0016c694:
  if (*(MemPage ***)(in_FS_OFFSET + 0x28) == ppPage) {
    return local_3c;
  }
  __stack_chk_fail();
}

Assistant:

static int incrVacuumStep(BtShared *pBt, Pgno nFin, Pgno iLastPg, int bCommit){
  Pgno nFreeList;           /* Number of pages still on the free-list */
  int rc;

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( iLastPg>nFin );

  if( !PTRMAP_ISPAGE(pBt, iLastPg) && iLastPg!=PENDING_BYTE_PAGE(pBt) ){
    u8 eType;
    Pgno iPtrPage;

    nFreeList = get4byte(&pBt->pPage1->aData[36]);
    if( nFreeList==0 ){
      return SQLITE_DONE;
    }

    rc = ptrmapGet(pBt, iLastPg, &eType, &iPtrPage);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( eType==PTRMAP_ROOTPAGE ){
      return SQLITE_CORRUPT_BKPT;
    }

    if( eType==PTRMAP_FREEPAGE ){
      if( bCommit==0 ){
        /* Remove the page from the files free-list. This is not required
        ** if bCommit is non-zero. In that case, the free-list will be
        ** truncated to zero after this function returns, so it doesn't
        ** matter if it still contains some garbage entries.
        */
        Pgno iFreePg;
        MemPage *pFreePg;
        rc = allocateBtreePage(pBt, &pFreePg, &iFreePg, iLastPg, BTALLOC_EXACT);
        if( rc!=SQLITE_OK ){
          return rc;
        }
        assert( iFreePg==iLastPg );
        releasePage(pFreePg);
      }
    } else {
      Pgno iFreePg;             /* Index of free page to move pLastPg to */
      MemPage *pLastPg;
      u8 eMode = BTALLOC_ANY;   /* Mode parameter for allocateBtreePage() */
      Pgno iNear = 0;           /* nearby parameter for allocateBtreePage() */

      rc = btreeGetPage(pBt, iLastPg, &pLastPg, 0);
      if( rc!=SQLITE_OK ){
        return rc;
      }

      /* If bCommit is zero, this loop runs exactly once and page pLastPg
      ** is swapped with the first free page pulled off the free list.
      **
      ** On the other hand, if bCommit is greater than zero, then keep
      ** looping until a free-page located within the first nFin pages
      ** of the file is found.
      */
      if( bCommit==0 ){
        eMode = BTALLOC_LE;
        iNear = nFin;
      }
      do {
        MemPage *pFreePg;
        Pgno dbSize = btreePagecount(pBt);
        rc = allocateBtreePage(pBt, &pFreePg, &iFreePg, iNear, eMode);
        if( rc!=SQLITE_OK ){
          releasePage(pLastPg);
          return rc;
        }
        releasePage(pFreePg);
        if( iFreePg>dbSize ){
          releasePage(pLastPg);
          return SQLITE_CORRUPT_BKPT;
        }
      }while( bCommit && iFreePg>nFin );
      assert( iFreePg<iLastPg );

      rc = relocatePage(pBt, pLastPg, eType, iPtrPage, iFreePg, bCommit);
      releasePage(pLastPg);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }
  }

  if( bCommit==0 ){
    do {
      iLastPg--;
    }while( iLastPg==PENDING_BYTE_PAGE(pBt) || PTRMAP_ISPAGE(pBt, iLastPg) );
    pBt->bDoTruncate = 1;
    pBt->nPage = iLastPg;
  }
  return SQLITE_OK;
}